

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

CURLcode Curl_proxy_connect(connectdata *conn,int sockindex)

{
  void *pvVar1;
  CURLcode CVar2;
  uint local_24c;
  CURLcode result_1;
  int remote_port;
  char *hostname;
  void *prot_save;
  HTTP http_proxy;
  CURLcode result;
  int sockindex_local;
  connectdata *conn_local;
  
  http_proxy.send_buffer._4_4_ = sockindex;
  if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
    CVar2 = https_proxy_connect(conn,sockindex);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    if (((conn->bits).proxy_ssl_connected[http_proxy.send_buffer._4_4_] & 1U) == 0) {
      return CURLE_OK;
    }
    http_proxy.send_buffer._0_4_ = 0;
  }
  if (((*(uint *)&(conn->bits).field_0x4 >> 0xf & 1) != 0) &&
     ((*(uint *)&(conn->bits).field_0x4 >> 6 & 1) != 0)) {
    pvVar1 = (conn->data->req).protop;
    memset(&prot_save,0,0x218);
    (conn->data->req).protop = &prot_save;
    Curl_conncontrol(conn,0);
    if ((*(uint *)&(conn->bits).field_0x4 >> 3 & 1) == 0) {
      if (http_proxy.send_buffer._4_4_ == 1) {
        _result_1 = conn->secondaryhostname;
      }
      else {
        _result_1 = (conn->host).name;
      }
    }
    else {
      _result_1 = (conn->conn_to_host).name;
    }
    if (http_proxy.send_buffer._4_4_ == 1) {
      local_24c = (uint)conn->secondary_port;
    }
    else if ((*(uint *)&(conn->bits).field_0x4 >> 4 & 1) == 0) {
      local_24c = conn->remote_port;
    }
    else {
      local_24c = conn->conn_to_port;
    }
    CVar2 = Curl_proxyCONNECT(conn,http_proxy.send_buffer._4_4_,_result_1,local_24c);
    (conn->data->req).protop = pvVar1;
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    (*Curl_cfree)((conn->allocptr).proxyuserpwd);
    (conn->allocptr).proxyuserpwd = (char *)0x0;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_proxy_connect(struct connectdata *conn, int sockindex)
{
  if(conn->http_proxy.proxytype == CURLPROXY_HTTPS) {
    const CURLcode result = https_proxy_connect(conn, sockindex);
    if(result)
      return result;
    if(!conn->bits.proxy_ssl_connected[sockindex])
      return result; /* wait for HTTPS proxy SSL initialization to complete */
  }

  if(conn->bits.tunnel_proxy && conn->bits.httpproxy) {
#ifndef CURL_DISABLE_PROXY
    /* for [protocol] tunneled through HTTP proxy */
    struct HTTP http_proxy;
    void *prot_save;
    const char *hostname;
    int remote_port;
    CURLcode result;

    /* BLOCKING */
    /* We want "seamless" operations through HTTP proxy tunnel */

    /* Curl_proxyCONNECT is based on a pointer to a struct HTTP at the
     * member conn->proto.http; we want [protocol] through HTTP and we have
     * to change the member temporarily for connecting to the HTTP
     * proxy. After Curl_proxyCONNECT we have to set back the member to the
     * original pointer
     *
     * This function might be called several times in the multi interface case
     * if the proxy's CONNECT response is not instant.
     */
    prot_save = conn->data->req.protop;
    memset(&http_proxy, 0, sizeof(http_proxy));
    conn->data->req.protop = &http_proxy;
    connkeep(conn, "HTTP proxy CONNECT");

    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */

    if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else if(sockindex == SECONDARYSOCKET)
      hostname = conn->secondaryhostname;
    else
      hostname = conn->host.name;

    if(sockindex == SECONDARYSOCKET)
      remote_port = conn->secondary_port;
    else if(conn->bits.conn_to_port)
      remote_port = conn->conn_to_port;
    else
      remote_port = conn->remote_port;
    result = Curl_proxyCONNECT(conn, sockindex, hostname, remote_port);
    conn->data->req.protop = prot_save;
    if(CURLE_OK != result)
      return result;
    Curl_safefree(conn->allocptr.proxyuserpwd);
#else
    return CURLE_NOT_BUILT_IN;
#endif
  }
  /* no HTTP tunnel proxy, just return */
  return CURLE_OK;
}